

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void OP_gcref(void)

{
  if (((*(ushort *)((ulong)(MDStypetbl + (MachineState.tosvalue >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      MachineState.tosvalue =
           rec_htfind(MachineState.tosvalue,(uint)*(byte *)((ulong)(MachineState.currentpc + 1) ^ 3)
                     );
    }
    else {
      MachineState.tosvalue =
           htfind(MachineState.tosvalue,(uint)*(byte *)((ulong)(MachineState.currentpc + 1) ^ 3));
    }
  }
  else {
    MachineState.tosvalue = 0;
  }
  MachineState.currentpc = MachineState.currentpc + 2;
  return;
}

Assistant:

void OP_gcref(void) {
#ifdef TRACE
  printPC();
  printf("TRACE:OP_gcref()\n");
#endif
  GCLOOKUPV(TopOfStack, Get_code_BYTE(PC + 1), TopOfStack);
  PC += 2;
  return;
}